

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncSFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  char cVar1;
  uintptr_t uVar2;
  double dVar3;
  
  dVar3 = (double)wasm::Literal::getFloat();
  if (NAN(dVar3)) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncSFloat of nan");
  }
  uVar2 = (value->type).id;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 2) {
    if (uVar2 == 5) {
      cVar1 = wasm::isInRangeI32TruncS((value->field_0).i64);
    }
    else {
      if (uVar2 != 4) {
LAB_001c9a25:
        __assert_fail("type == Type::f64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x14f,"int64_t wasm::Literal::reinterpreti64() const");
      }
      cVar1 = wasm::isInRangeI32TruncS((value->field_0).i32);
    }
    if (cVar1 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i32.truncSFloat overflow");
    }
    (__return_storage_ptr__->field_0).i32 = (int)dVar3;
    uVar2 = 2;
  }
  else {
    if (uVar2 == 5) {
      cVar1 = wasm::isInRangeI64TruncS((value->field_0).i64);
    }
    else {
      if (uVar2 != 4) goto LAB_001c9a25;
      cVar1 = wasm::isInRangeI64TruncS((value->field_0).i32);
    }
    if (cVar1 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i64.truncSFloat overflow");
    }
    (__return_storage_ptr__->field_0).i64 = (long)dVar3;
    uVar2 = 3;
  }
  (__return_storage_ptr__->type).id = uVar2;
  return __return_storage_ptr__;
}

Assistant:

Literal truncSFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncSFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncS(value.reinterpreti32())) {
          trap("i32.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncS(value.reinterpreti64())) {
          trap("i32.truncSFloat overflow");
        }
      }
      return Literal(int32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncS(value.reinterpreti32())) {
          trap("i64.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncS(value.reinterpreti64())) {
          trap("i64.truncSFloat overflow");
        }
      }
      return Literal(int64_t(val));
    }
  }